

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QString * __thiscall QAccessibleWidget::text(QAccessibleWidget *this,Text t)

{
  byte bVar1;
  bool bVar2;
  QWindow *pQVar3;
  long *plVar4;
  undefined4 in_EDX;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPlatformWindow *platformWindow;
  QWindow *window;
  QString *str;
  QString *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  QWidget *this_00;
  QWidget *in_stack_fffffffffffffec8;
  uint3 in_stack_fffffffffffffed8;
  uint uVar5;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_fffffffffffffed8;
  *(undefined1 **)&in_RDI->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x7ddfa3);
  switch(in_EDX) {
  case 0:
    bVar2 = QString::isEmpty((QString *)0x7ddfde);
    if (bVar2) {
      widget((QAccessibleWidget *)0x7de008);
      QWidget::accessibleName(this_00);
      bVar2 = QString::isEmpty((QString *)0x7de025);
      bVar1 = bVar2 ^ 0xff;
      QString::~QString((QString *)0x7de038);
      if ((bVar1 & 1) == 0) {
        widget((QAccessibleWidget *)0x7de08a);
        bVar2 = QWidget::isWindow((QWidget *)CONCAT17(bVar1,in_stack_fffffffffffffea0));
        if (bVar2) {
          widget((QAccessibleWidget *)0x7de0a2);
          pQVar3 = QWidget::windowHandle((QWidget *)CONCAT17(bVar1,in_stack_fffffffffffffea0));
          if ((pQVar3 != (QWindow *)0x0) &&
             (plVar4 = (long *)QWindow::handle(), plVar4 != (long *)0x0)) {
            (**(code **)(*plVar4 + 0x80))(local_50);
            QString::operator=((QString *)CONCAT17(bVar1,in_stack_fffffffffffffea0),
                               in_stack_fffffffffffffe98);
            QString::~QString((QString *)0x7de103);
          }
        }
        else {
          widget((QAccessibleWidget *)0x7de111);
          buddyString(in_stack_fffffffffffffec8);
          qt_accStripAmp((QString *)CONCAT44(in_EDX,uVar5));
          QString::operator=((QString *)CONCAT17(bVar1,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98);
          QString::~QString((QString *)0x7de155);
          QString::~QString((QString *)0x7de162);
        }
      }
      else {
        widget((QAccessibleWidget *)0x7de04c);
        QWidget::accessibleName(this_00);
        QString::operator=((QString *)CONCAT17(bVar1,in_stack_fffffffffffffea0),
                           in_stack_fffffffffffffe98);
        QString::~QString((QString *)0x7de07b);
      }
    }
    else {
      QString::operator=((QString *)this_00,(QString *)(*(long *)(in_RSI + 0x18) + 8));
    }
    break;
  case 1:
    widget((QAccessibleWidget *)0x7de175);
    QWidget::accessibleDescription(this_00);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x7de1a4);
    bVar2 = QString::isEmpty((QString *)0x7de1ae);
    if (bVar2) {
      widget((QAccessibleWidget *)0x7de1be);
      QWidget::toolTip(this_00);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                         in_stack_fffffffffffffe98);
      QString::~QString((QString *)0x7de1ed);
    }
    break;
  case 2:
    break;
  case 3:
    widget((QAccessibleWidget *)0x7de23a);
    QWidget::whatsThis(this_00);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x7de269);
    break;
  case 4:
    widget((QAccessibleWidget *)0x7de275);
    buddyString(in_stack_fffffffffffffec8);
    qt_accHotKey((QString *)this_00);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x7de2aa);
    QString::~QString((QString *)0x7de2b4);
    break;
  default:
    break;
  case 6:
    widget((QAccessibleWidget *)0x7de1fc);
    QWidget::accessibleIdentifier(this_00);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x7de22b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QAccessibleWidget::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        if (!d->name.isEmpty()) {
            str = d->name;
        } else if (!widget()->accessibleName().isEmpty()) {
            str = widget()->accessibleName();
        } else if (widget()->isWindow()) {
            if (QWindow *window = widget()->windowHandle()) {
                if (QPlatformWindow *platformWindow = window->handle())
                    str = platformWindow->windowTitle();
            }
        } else {
            str = qt_accStripAmp(buddyString(widget()));
        }
        break;
    case QAccessible::Description:
        str = widget()->accessibleDescription();
#if QT_CONFIG(tooltip)
        if (str.isEmpty())
            str = widget()->toolTip();
#endif
        break;
    case QAccessible::Identifier:
        str = widget()->accessibleIdentifier();
        break;
    case QAccessible::Help:
#if QT_CONFIG(whatsthis)
        str = widget()->whatsThis();
#endif
        break;
    case QAccessible::Accelerator:
        str = qt_accHotKey(buddyString(widget()));
        break;
    case QAccessible::Value:
        break;
    default:
        break;
    }
    return str;
}